

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.h
# Opt level: O0

bool __thiscall
cmWorkerPool::
EmplaceJob<cmQtAutoMocUic::JobMocT,std::shared_ptr<cmQtAutoMocUic::MappingT>const&,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>
          (cmWorkerPool *this,shared_ptr<cmQtAutoMocUic::MappingT> *args,
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args_1)

{
  bool bVar1;
  undefined1 local_30 [8];
  unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_> local_28;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local_1;
  shared_ptr<cmQtAutoMocUic::MappingT> *args_local;
  cmWorkerPool *this_local;
  
  local_20 = args_1;
  args_local_1 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)args;
  args_local = (shared_ptr<cmQtAutoMocUic::MappingT> *)this;
  std::
  make_unique<cmQtAutoMocUic::JobMocT,std::shared_ptr<cmQtAutoMocUic::MappingT>const&,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>
            ((shared_ptr<cmQtAutoMocUic::MappingT> *)local_30,
             (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)args);
  std::unique_ptr<cmWorkerPool::JobT,std::default_delete<cmWorkerPool::JobT>>::
  unique_ptr<cmQtAutoMocUic::JobMocT,std::default_delete<cmQtAutoMocUic::JobMocT>,void>
            ((unique_ptr<cmWorkerPool::JobT,std::default_delete<cmWorkerPool::JobT>> *)&local_28,
             (unique_ptr<cmQtAutoMocUic::JobMocT,_std::default_delete<cmQtAutoMocUic::JobMocT>_> *)
             local_30);
  bVar1 = PushJob(this,(JobHandleT *)&local_28);
  std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>::~unique_ptr
            (&local_28);
  std::unique_ptr<cmQtAutoMocUic::JobMocT,_std::default_delete<cmQtAutoMocUic::JobMocT>_>::
  ~unique_ptr((unique_ptr<cmQtAutoMocUic::JobMocT,_std::default_delete<cmQtAutoMocUic::JobMocT>_> *)
              local_30);
  return bVar1;
}

Assistant:

bool EmplaceJob(Args&&... args)
  {
    return PushJob(cm::make_unique<T>(std::forward<Args>(args)...));
  }